

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomNative.cpp
# Opt level: O3

PackageInfo * chatra::emb::random::packageInfo(void)

{
  char *pcVar1;
  char *pcVar2;
  PackageInfo *in_RDI;
  long lVar3;
  undefined1 *puVar4;
  initializer_list<chatra::Script> __l;
  initializer_list<chatra::NativeCallHandlerInfo> __l_00;
  undefined1 local_240 [16];
  undefined1 local_230 [24];
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  code *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [16];
  char *local_1b0;
  size_type local_1a8;
  char local_1a0 [8];
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined1 *local_190;
  undefined8 local_188;
  undefined1 local_180 [16];
  code *local_170;
  undefined1 *local_168;
  undefined8 local_160;
  undefined1 local_158 [16];
  char *local_148;
  size_type local_140;
  char local_138 [8];
  undefined8 uStack_130;
  undefined1 *local_128;
  undefined8 local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  vector<chatra::Script,_std::allocator<chatra::Script>_> scripts;
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> handlers;
  undefined1 local_c8 [16];
  char *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider _Stack_a0;
  char *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined8 uStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined8 local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  allocator_type local_31;
  
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &handlers.
              super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"random","");
  pcVar2 = local_b0._M_local_buf + 8;
  local_b8 = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "\n/*\n * Programming language \'Chatra\' reference implementation\n *\n * Copyright(C) 2020 Chatra Project Team\n *\n * Licensed under the Apache License, Version 2.0 (the \"License\");\n * you may not use this file except in compliance with the License.\n * You may obtain a copy of the License at\n *\n *   http://www.apache.org/licenses/LICENSE-2.0\n *\n * Unless required by applicable law or agreed to in writing, software\n * distributed under the License is distributed on an \"AS IS\" BASIS,\n * WITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\n * See the License for the specific language governing permissions and\n * limitations under the License.\n *\n * author: Satoshi Hosokawa (chatra.hosokawa@gmail.com)\n */\n\ndef _native_comply(first, last, value) as native\ndef _native_convert(first, last, value) as native\ndef _native_systemRandom() as native\n\nclass RandomGenerator\n\tdef init()\n\t\treturn\n\n\tdef nextU64()\n\t\tthrow UnsupportedOperationException()\n\n\tdef nextInt(first: Int, last: Int)\n\t\tif first >= last\n\t\t\tthrow IllegalArgumentException()\n\t\tvalue: 0\n\t\twhile true\n\t\t\tvalue = nextU64()\n\t\t\tif _native_comply(first, last, value)\n\t\t\t\tbreak\n\t\treturn _native_convert(first, last, value)\n\n\tdef nextInt(last: Int)\n\t\treturn nextInt(0, last)\n\n\tdef nextFloat()\n\t\treturn Float(nextU64() >>> 11) * (1.0 / 9007199254740992.0)\n\n\n// The SFMT implementation based on original C implementation of\n// SIMD-oriented Fast Mersenne Twister (SFMT)\n// see http://www.math.sci.hiroshima-u.ac.jp/~m-mat/MT/SFMT/index-jp.html\n\nvar SFMT_MEXP: 19937\n\nvar SFMT_POS1: 122\nvar SFMT_SL1: 18\nvar SFMT_SL2: 1\nvar SFMT_SR1: 11\nvar SFMT_SR2: 1\nvar SFMT_MSK1: 0xdfffffef\nvar SFMT_MSK2: 0xddfecb7f\nvar SFMT_MSK3: 0xbffaffff\nvar SFMT_MSK4: 0xbffffff6\nvar SFMT_PARITY1: 0x00000001\nvar SFMT_PARITY2: 0x00000000\nvar SFMT_PARITY3: 0x00000000\nvar SFMT_PARITY4: 0x13c9e684\n\nvar SFMT_N: SFMT_MEXP / 128 + 1\nvar SFMT_N32: SFMT_N * 4\n\nclass SfmtW128\n\tvar u: {0, 0, 0, 0}\n\nclass Sfmt extends RandomGenerator\n\tvar state: {for in Range(SFMT_N): SfmtW128()}\n\tvar idx: 0\n\n\tdef rshift128(o..." /* TRUNCATED STRING LITERAL */
             ,"");
  if (handlers.
      super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)local_c8) {
    local_230._8_8_ = local_c8._8_8_;
    local_240._0_8_ = (pointer)local_230;
  }
  else {
    local_240._0_8_ =
         handlers.
         super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  local_c8[0] = 0;
  if (local_b8 == pcVar2) {
    aStack_208._0_8_ = _Stack_a0._M_p;
    local_230._16_8_ = local_218 + 8;
  }
  else {
    local_230._16_8_ = local_b8;
  }
  local_218._0_8_ = local_b0._M_allocated_capacity;
  local_b0._M_allocated_capacity = 0;
  local_b0._M_local_buf[8] = '\0';
  __l._M_len = 1;
  __l._M_array = (iterator)local_240;
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8;
  local_b8 = pcVar2;
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_108,__l,
             (allocator_type *)
             &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((undefined1 *)local_230._16_8_ != local_218 + 8) {
    operator_delete((void *)local_230._16_8_);
  }
  if ((pointer)local_240._0_8_ != (pointer)local_230) {
    operator_delete((void *)local_240._0_8_);
  }
  if (local_b8 != pcVar2) {
    operator_delete(local_b8);
  }
  if (handlers.
      super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_c8) {
    operator_delete(handlers.
                    super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"_native_comply","");
  local_240._8_8_ = local_230 + 8;
  local_240._0_8_ = comply;
  local_230._0_8_ = (NativeCallHandler)0x0;
  local_230._8_8_ = local_230._8_8_ & 0xffffffffffffff00;
  local_218._0_8_ = &aStack_208;
  if (local_58 == &local_48) {
    aStack_208._8_4_ = local_48._8_4_;
    aStack_208._12_4_ = local_48._12_4_;
  }
  else {
    local_218._0_8_ = local_58;
  }
  local_1f8._M_allocated_capacity = (size_type)&local_1e8;
  local_218._8_8_ = local_50;
  local_50 = 0;
  local_48._M_allocated_capacity._0_4_ = local_48._M_allocated_capacity._0_4_ & 0xffffff00;
  local_1f8._8_8_ = 0;
  local_1e8._M_local_buf[0] = '\0';
  pcVar2 = local_90._M_local_buf + 8;
  local_98 = pcVar2;
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"_native_convert","");
  local_1d0 = local_1c0;
  local_1d8 = convert;
  local_1c8 = 0;
  local_1c0[0] = 0;
  local_1b0 = local_1a0;
  if (local_98 == pcVar2) {
    uStack_198 = uStack_80;
    uStack_194 = uStack_7c;
  }
  else {
    local_1b0 = local_98;
  }
  local_190 = local_180;
  local_1a8 = local_90._M_allocated_capacity;
  local_90._M_allocated_capacity = 0;
  local_90._8_4_ = local_90._8_4_ & 0xffffff00;
  local_188 = 0;
  local_180[0] = 0;
  pcVar1 = local_70._M_local_buf + 8;
  local_98 = pcVar2;
  local_78 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"_native_systemRandom","");
  local_168 = local_158;
  local_170 = systemRandom;
  local_160 = 0;
  local_158[0] = 0;
  local_148 = local_138;
  if (local_78 == pcVar1) {
    uStack_130 = uStack_60;
  }
  else {
    local_148 = local_78;
  }
  puVar4 = local_118;
  local_140 = local_70._M_allocated_capacity;
  local_70._M_allocated_capacity = 0;
  local_70._M_local_buf[8] = '\0';
  local_120 = 0;
  local_118[0] = 0;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_240;
  local_128 = puVar4;
  local_78 = pcVar1;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            ((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,__l_00,&local_31);
  lVar3 = -0x138;
  do {
    if (puVar4 != *(undefined1 **)(puVar4 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar4 + -0x10));
    }
    if (puVar4 + -0x20 != *(undefined1 **)(puVar4 + -0x30)) {
      operator_delete(*(undefined1 **)(puVar4 + -0x30));
    }
    if (puVar4 + -0x40 != *(undefined1 **)(puVar4 + -0x50)) {
      operator_delete(*(undefined1 **)(puVar4 + -0x50));
    }
    puVar4 = puVar4 + -0x68;
    lVar3 = lVar3 + 0x68;
  } while (lVar3 != 0);
  if (local_78 != pcVar1) {
    operator_delete(local_78);
  }
  if (local_98 != pcVar2) {
    operator_delete(local_98);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            (&in_RDI->scripts,(vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_108);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            (&in_RDI->handlers,
             (vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
  (in_RDI->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (in_RDI->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
  ~vector((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *)
          &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_108);
  return in_RDI;
}

Assistant:

PackageInfo packageInfo() {
	std::vector<Script> scripts = {{"random", script}};
	std::vector<HandlerInfo> handlers = {
			{comply, "_native_comply"},
			{convert, "_native_convert"},
			{systemRandom, "_native_systemRandom"},
	};
	return {scripts, handlers, nullptr};
}